

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O1

llbuild_rlim_t llbuild::basic::sys::getOpenFileLimit(void)

{
  int iVar1;
  rlimit rl;
  rlimit local_10;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,&local_10);
  if (iVar1 != 0) {
    local_10.rlim_cur = 0;
  }
  return local_10.rlim_cur;
}

Assistant:

llbuild_rlim_t sys::getOpenFileLimit() {
#if defined(_WIN32)
  return _getmaxstdio();
#else
  struct rlimit rl;
  int ret = getrlimit(RLIMIT_NOFILE, &rl);
  if (ret != 0) {
    return 0;
  }

  return rl.rlim_cur;
#endif
}